

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etdc.c
# Opt level: O1

void etdc_add(etdc_table **table,uint s)

{
  UT_hash_bucket *pUVar1;
  uint *puVar2;
  etdc_table *peVar3;
  UT_hash_table *pUVar4;
  UT_hash_handle *pUVar5;
  UT_hash_bucket *pUVar6;
  UT_hash_handle *pUVar7;
  UT_hash_handle *pUVar8;
  uint uVar9;
  etdc_table *peVar10;
  UT_hash_table *pUVar11;
  UT_hash_bucket *pUVar12;
  UT_hash_handle *pUVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  size_t __size;
  uint s_local;
  
  if (*table == (etdc_table *)0x0) {
LAB_00101d09:
    lVar14 = 0;
  }
  else {
    s_local._2_1_ = (char)(s >> 0x10);
    s_local._1_1_ = (char)(s >> 8);
    s_local._0_1_ = (char)s;
    uVar17 = (int)(char)s_local + s_local._1_1_ * 0x100 + s_local._2_1_ * 0x10000 + (s & 0xff000000)
             + 0x112410d ^ 0x7f76d;
    uVar15 = uVar17 << 8 ^ 0x9f49bac6 - uVar17;
    uVar18 = uVar15 >> 0xd ^ (-0x112410d - uVar17) - uVar15;
    uVar19 = uVar18 >> 0xc ^ (uVar17 - uVar15) - uVar18;
    uVar17 = uVar19 << 0x10 ^ (uVar15 - uVar18) - uVar19;
    uVar15 = uVar17 >> 5 ^ (uVar18 - uVar19) - uVar17;
    uVar18 = uVar15 >> 3 ^ (uVar19 - uVar17) - uVar15;
    uVar17 = uVar18 << 10 ^ (uVar17 - uVar15) - uVar18;
    pUVar11 = ((*table)->hh).tbl;
    pUVar13 = pUVar11->buckets
              [pUVar11->num_buckets - 1 & (uVar17 >> 0xf ^ uVar15 - (uVar18 + uVar17))].hh_head;
    while( true ) {
      if (pUVar13 == (UT_hash_handle *)0x0) {
        lVar14 = 0;
      }
      else {
        lVar14 = (long)pUVar13 - pUVar11->hho;
      }
      if (lVar14 == 0) goto LAB_00101d09;
      if ((*(int *)(lVar14 + 0x48) == 4) && (**(uint **)(lVar14 + 0x40) == s)) break;
      pUVar13 = *(UT_hash_handle **)(lVar14 + 0x38);
    }
  }
  if (lVar14 != 0) {
    *(int *)(lVar14 + 4) = *(int *)(lVar14 + 4) + 1;
    return;
  }
  peVar10 = (etdc_table *)malloc(0x50);
  peVar10->symbol = s;
  peVar10->freq = 1;
  pUVar13 = &peVar10->hh;
  (peVar10->hh).next = (void *)0x0;
  (peVar10->hh).key = peVar10;
  (peVar10->hh).keylen = 4;
  if (*table == (etdc_table *)0x0) {
    *table = peVar10;
    (peVar10->hh).prev = (void *)0x0;
    pUVar11 = (UT_hash_table *)malloc(0x40);
    (peVar10->hh).tbl = pUVar11;
    if (pUVar11 == (UT_hash_table *)0x0) goto LAB_00101c01;
    *(undefined8 *)&pUVar11->num_items = 0;
    pUVar11->tail = (UT_hash_handle *)0x0;
    pUVar11->buckets = (UT_hash_bucket *)0x0;
    pUVar11->num_buckets = 0;
    pUVar11->log2_num_buckets = 0;
    pUVar11->hho = 0;
    pUVar11->ideal_chain_maxlen = 0;
    pUVar11->nonideal_items = 0;
    pUVar11->ineff_expands = 0;
    pUVar11->noexpand = 0;
    *(undefined8 *)&pUVar11->signature = 0;
    pUVar11->tail = pUVar13;
    pUVar11->num_buckets = 0x20;
    pUVar11->log2_num_buckets = 5;
    pUVar11->hho = 0x18;
    pUVar12 = (UT_hash_bucket *)malloc(0x200);
    pUVar11->buckets = pUVar12;
    if (pUVar12 == (UT_hash_bucket *)0x0) goto LAB_00101c01;
    memset(pUVar12,0,0x200);
    pUVar11->signature = 0xa0111fe1;
  }
  else {
    (((*table)->hh).tbl)->tail->next = peVar10;
    pUVar11 = ((*table)->hh).tbl;
    (peVar10->hh).prev = (void *)((long)pUVar11->tail - pUVar11->hho);
    pUVar11->tail = pUVar13;
  }
  peVar3 = *table;
  pUVar11 = (peVar3->hh).tbl;
  pUVar11->num_items = pUVar11->num_items + 1;
  (peVar10->hh).tbl = pUVar11;
  uVar17 = (int)(char)peVar10->symbol +
           *(char *)((long)&peVar10->symbol + 1) * 0x100 +
           *(char *)((long)&peVar10->symbol + 2) * 0x10000 +
           (uint)*(byte *)((long)&peVar10->symbol + 3) * 0x1000000 + 0x112410d ^ 0x7f76d;
  uVar15 = uVar17 << 8 ^ 0x9f49bac6 - uVar17;
  uVar18 = uVar15 >> 0xd ^ (-0x112410d - uVar17) - uVar15;
  uVar19 = uVar18 >> 0xc ^ (uVar17 - uVar15) - uVar18;
  uVar17 = uVar19 << 0x10 ^ (uVar15 - uVar18) - uVar19;
  uVar15 = uVar17 >> 5 ^ (uVar18 - uVar19) - uVar17;
  uVar18 = uVar15 >> 3 ^ (uVar19 - uVar17) - uVar15;
  uVar17 = uVar18 << 10 ^ (uVar17 - uVar15) - uVar18;
  uVar15 = uVar17 >> 0xf ^ uVar15 - (uVar18 + uVar17);
  (peVar10->hh).hashv = uVar15;
  pUVar4 = (peVar3->hh).tbl;
  uVar15 = pUVar4->num_buckets - 1 & uVar15;
  pUVar12 = pUVar4->buckets;
  puVar2 = &pUVar12[uVar15].count;
  *puVar2 = *puVar2 + 1;
  pUVar5 = pUVar12[uVar15].hh_head;
  (peVar10->hh).hh_next = pUVar5;
  (peVar10->hh).hh_prev = (UT_hash_handle *)0x0;
  if (pUVar5 != (UT_hash_handle *)0x0) {
    pUVar5->hh_prev = pUVar13;
  }
  (((*table)->hh).tbl)->buckets[uVar15].hh_head = pUVar13;
  pUVar12 = (((*table)->hh).tbl)->buckets;
  if ((pUVar12[uVar15].expand_mult * 10 + 10 <= pUVar12[uVar15].count) && (pUVar11->noexpand != 1))
  {
    __size = (ulong)(pUVar11->num_buckets * 2) << 4;
    pUVar12 = (UT_hash_bucket *)malloc(__size);
    if (pUVar12 == (UT_hash_bucket *)0x0) {
LAB_00101c01:
      exit(-1);
    }
    uVar17 = 0;
    memset(pUVar12,0,__size);
    uVar15 = pUVar11->num_buckets;
    uVar19 = uVar15 * 2 - 1;
    uVar18 = ((pUVar11->num_items >> ((char)pUVar11->log2_num_buckets + 1U & 0x1f)) + 1) -
             (uint)((uVar19 & pUVar11->num_items) == 0);
    pUVar11->ideal_chain_maxlen = uVar18;
    pUVar11->nonideal_items = 0;
    if ((ulong)uVar15 != 0) {
      pUVar6 = pUVar11->buckets;
      uVar20 = 0;
      do {
        pUVar5 = pUVar6[uVar20].hh_head;
        while (pUVar5 != (UT_hash_handle *)0x0) {
          pUVar7 = pUVar5->hh_next;
          uVar16 = pUVar5->hashv & uVar19;
          pUVar1 = pUVar12 + uVar16;
          uVar9 = pUVar12[uVar16].count + 1;
          pUVar12[uVar16].count = uVar9;
          if (uVar18 < uVar9) {
            pUVar11->nonideal_items = pUVar11->nonideal_items + 1;
            pUVar1->expand_mult = uVar9 / uVar18;
          }
          pUVar5->hh_prev = (UT_hash_handle *)0x0;
          pUVar8 = pUVar1->hh_head;
          pUVar5->hh_next = pUVar8;
          if (pUVar8 != (UT_hash_handle *)0x0) {
            pUVar8->hh_prev = pUVar5;
          }
          pUVar1->hh_head = pUVar5;
          pUVar5 = pUVar7;
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 != uVar15);
    }
    free(pUVar11->buckets);
    pUVar11 = pUVar13->tbl;
    pUVar11->num_buckets = pUVar11->num_buckets << 1;
    pUVar11->log2_num_buckets = pUVar11->log2_num_buckets + 1;
    pUVar11->buckets = pUVar12;
    if (pUVar11->num_items >> 1 < pUVar11->nonideal_items) {
      uVar17 = pUVar11->ineff_expands + 1;
    }
    pUVar11->ineff_expands = uVar17;
    if (1 < uVar17) {
      pUVar11->noexpand = 1;
    }
  }
  return;
}

Assistant:

void etdc_add(struct etdc_table **table, unsigned int s) {
  struct etdc_table *e;

  HASH_FIND_INT( *table, &s, e);

  if (NULL == e) {
    //add symbol to table
    //fprintf(stderr,"No symbol found in table... creating one");
    etdc_new_symbol(table, s);
  } else {
    //increment frequency
    //fprintf(stderr,"Incrementing frequency of symbol in etdc table");
    e->freq++;
  }
}